

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O2

wchar_t archive_read_open_filename_w(archive *a,wchar_t *wfilename,size_t block_size)

{
  wchar_t wVar1;
  int iVar2;
  size_t sVar3;
  undefined4 *__ptr;
  int *piVar4;
  char *fmt;
  wchar_t *wfilename_1;
  wchar_t **ppwVar5;
  archive_string local_68;
  wchar_t *wfilenames [2];
  
  ppwVar5 = wfilenames;
  wfilenames[1] = (wchar_t *)0x0;
  wfilenames[0] = wfilename;
  archive_clear_error(a);
  while( true ) {
    ppwVar5 = ppwVar5 + 1;
    if (wfilename == (wchar_t *)0x0) {
      wfilename = anon_var_dwarf_55d09 + 6;
    }
    sVar3 = wcslen(wfilename);
    __ptr = (undefined4 *)calloc(1,sVar3 * 4 + 0x28);
    if (__ptr == (undefined4 *)0x0) {
      archive_set_error(a,0xc,"No memory");
      return L'\xffffffe2';
    }
    *(size_t *)(__ptr + 2) = block_size;
    *__ptr = 0xffffffff;
    if (*wfilename == L'\0') {
      __ptr[8] = 0;
    }
    else {
      local_68.s = (char *)0x0;
      local_68.length = 0;
      local_68.buffer_length = 0;
      sVar3 = wcslen(wfilename);
      wVar1 = archive_string_append_from_wcs(&local_68,wfilename,sVar3);
      if (wVar1 != L'\0') {
        piVar4 = __errno_location();
        if (*piVar4 == 0xc) {
          fmt = "Can\'t allocate memory";
          iVar2 = 0xc;
        }
        else {
          fmt = "Failed to convert a wide-character filename to a multi-byte filename";
          iVar2 = 0x16;
        }
        archive_set_error(a,iVar2,fmt);
        archive_string_free(&local_68);
        free(__ptr);
        return L'\xffffffe2';
      }
      __ptr[8] = 1;
      strcpy((char *)(__ptr + 9),local_68.s);
      archive_string_free(&local_68);
    }
    iVar2 = archive_read_append_callback_data(a,__ptr);
    if (iVar2 != 0) break;
    wfilename = *ppwVar5;
    if ((wfilename == (wchar_t *)0x0) || (*wfilename == L'\0')) {
      archive_read_set_open_callback(a,file_open);
      archive_read_set_read_callback(a,file_read);
      archive_read_set_skip_callback(a,file_skip);
      archive_read_set_close_callback(a,file_close);
      archive_read_set_switch_callback(a,file_switch);
      archive_read_set_seek_callback(a,file_seek);
      wVar1 = archive_read_open1(a);
      return wVar1;
    }
  }
  return L'\xffffffe2';
}

Assistant:

int
archive_read_open_filename_w(struct archive *a, const wchar_t *wfilename,
    size_t block_size)
{
	const wchar_t *wfilenames[2];
	wfilenames[0] = wfilename;
	wfilenames[1] = NULL;
	return archive_read_open_filenames_w(a, wfilenames, block_size);
}